

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O1

line * lalloc(int used)

{
  line *__ptr;
  char *pcVar1;
  
  __ptr = (line *)malloc(0x20);
  if (__ptr != (line *)0x0) {
    __ptr->l_text = (char *)0x0;
    __ptr->l_size = 0;
    __ptr->l_used = used;
    if (used < 1) {
      return __ptr;
    }
    pcVar1 = (char *)malloc((ulong)(uint)used);
    if (pcVar1 != (char *)0x0) {
      __ptr->l_text = pcVar1;
      __ptr->l_size = used;
      return __ptr;
    }
    free(__ptr);
  }
  return (line *)0x0;
}

Assistant:

struct line *
lalloc(int used)
{
	struct line *lp;

	if ((lp = malloc(sizeof(*lp))) == NULL)
		return (NULL);
	lp->l_text = NULL;
	lp->l_size = 0;
	lp->l_used = used;	/* XXX */
	if (lrealloc(lp, used) == FALSE) {
		free(lp);
		return (NULL);
	}
	return (lp);
}